

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O1

GLenum __thiscall
glcts::TessellationShaderErrorsTestCaseBase::getGLEnumForPipelineStage
          (TessellationShaderErrorsTestCaseBase *this,_pipeline_stage stage)

{
  GLenum GVar1;
  TestError *this_00;
  
  switch(stage) {
  case PIPELINE_STAGE_FIRST:
    GVar1 = 0x8b30;
    break;
  case PIPELINE_STAGE_TESSELLATION_CONTROL:
    GVar1 = (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER;
    break;
  case PIPELINE_STAGE_TESSELLATION_EVALUATION:
    GVar1 = (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER;
    break;
  case PIPELINE_STAGE_VERTEX:
    GVar1 = 0x8b31;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized pipeline stage",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderErrors.cpp"
               ,0x23e);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  return GVar1;
}

Assistant:

glw::GLenum TessellationShaderErrorsTestCaseBase::getGLEnumForPipelineStage(_pipeline_stage stage)
{
	glw::GLenum result = GL_NONE;

	switch (stage)
	{
	case PIPELINE_STAGE_FRAGMENT:
		result = GL_FRAGMENT_SHADER;
		break;
	case PIPELINE_STAGE_TESSELLATION_CONTROL:
		result = m_glExtTokens.TESS_CONTROL_SHADER;
		break;
	case PIPELINE_STAGE_TESSELLATION_EVALUATION:
		result = m_glExtTokens.TESS_EVALUATION_SHADER;
		break;
	case PIPELINE_STAGE_VERTEX:
		result = GL_VERTEX_SHADER;
		break;

	default:
	{
		TCU_FAIL("Unrecognized pipeline stage");
	}
	}

	return result;
}